

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_geom_nodes(REF_INTERP ref_interp)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *recv_bary;
  REF_DBL *send_bary;
  REF_INT *recv_node;
  REF_INT *send_node;
  REF_INT *recv_cell;
  REF_INT *send_cell;
  REF_INT *recv_proc;
  REF_INT *my_proc;
  REF_INT *send_proc;
  REF_INT nrecv;
  REF_INT nsend;
  REF_DBL *best_dist;
  REF_DBL dist;
  REF_INT *from_proc;
  REF_INT *best_node;
  REF_INT *pRStack_98;
  REF_INT i;
  REF_INT *source;
  void *pvStack_88;
  REF_INT total_node;
  REF_INT *global_node;
  REF_INT *local_node;
  REF_DBL *global_xyz;
  REF_DBL *local_xyz;
  REF_DBL *xyz;
  REF_INT from_item;
  REF_INT to_item;
  REF_INT from_geom_node;
  REF_INT to_geom_node;
  REF_LIST from_geom_list;
  REF_LIST to_geom_list;
  REF_NODE from_node;
  REF_NODE to_node;
  REF_MPI ref_mpi;
  REF_GRID to_grid;
  REF_GRID from_grid;
  REF_INTERP ref_interp_local;
  
  to_grid = ref_interp->from_grid;
  ref_mpi = (REF_MPI)ref_interp->to_grid;
  to_node = (REF_NODE)ref_interp->ref_mpi;
  from_node = ((REF_GRID)ref_mpi)->node;
  to_geom_list = (REF_LIST)to_grid->node;
  from_grid = (REF_GRID)ref_interp;
  uVar1 = ref_list_create(&from_geom_list);
  if (uVar1 == 0) {
    uVar1 = ref_list_create((REF_LIST *)&from_geom_node);
    if (uVar1 == 0) {
      uVar1 = ref_interp_geom_node_list((REF_GRID)ref_mpi,from_geom_list);
      if (uVar1 == 0) {
        uVar1 = ref_interp_geom_node_list(to_grid,_from_geom_node);
        if (uVar1 == 0) {
          if (from_geom_list->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3f2,"ref_interp_geom_nodes","malloc local_node of REF_INT negative");
            ref_interp_local._4_4_ = 1;
          }
          else {
            global_node = (REF_INT *)malloc((long)from_geom_list->n << 2);
            if (global_node == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x3f2,"ref_interp_geom_nodes","malloc local_node of REF_INT NULL");
              ref_interp_local._4_4_ = 2;
            }
            else if (from_geom_list->n * 3 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x3f3,"ref_interp_geom_nodes","malloc local_xyz of REF_DBL negative");
              ref_interp_local._4_4_ = 1;
            }
            else {
              global_xyz = (REF_DBL *)malloc((long)(from_geom_list->n * 3) << 3);
              if (global_xyz == (REF_DBL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x3f3,"ref_interp_geom_nodes","malloc local_xyz of REF_DBL NULL");
                ref_interp_local._4_4_ = 2;
              }
              else {
                for (xyz._4_4_ = 0; xyz._4_4_ < from_geom_list->n; xyz._4_4_ = xyz._4_4_ + 1) {
                  to_item = from_geom_list->value[xyz._4_4_];
                  global_node[xyz._4_4_] = to_item;
                  global_xyz[xyz._4_4_ * 3] = from_node->real[to_item * 0xf];
                  global_xyz[xyz._4_4_ * 3 + 1] = from_node->real[to_item * 0xf + 1];
                  global_xyz[xyz._4_4_ * 3 + 2] = from_node->real[to_item * 0xf + 2];
                }
                uVar1 = ref_mpi_allconcat((REF_MPI)to_node,3,from_geom_list->n,global_xyz,
                                          (REF_INT *)((long)&source + 4),&stack0xffffffffffffff68,
                                          &local_node,3);
                if (uVar1 == 0) {
                  if (pRStack_98 != (REF_INT *)0x0) {
                    free(pRStack_98);
                  }
                  uVar1 = ref_mpi_allconcat((REF_MPI)to_node,1,from_geom_list->n,global_node,
                                            (REF_INT *)((long)&source + 4),&stack0xffffffffffffff68,
                                            &stack0xffffffffffffff78,1);
                  if (uVar1 == 0) {
                    if (source._4_4_ < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x405,"ref_interp_geom_nodes","malloc best_dist of REF_DBL negative");
                      ref_interp_local._4_4_ = 1;
                    }
                    else {
                      _nrecv = (REF_DBL *)malloc((long)source._4_4_ << 3);
                      if (_nrecv == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x405,"ref_interp_geom_nodes","malloc best_dist of REF_DBL NULL");
                        ref_interp_local._4_4_ = 2;
                      }
                      else if (source._4_4_ < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x406,"ref_interp_geom_nodes","malloc best_node of REF_INT negative"
                              );
                        ref_interp_local._4_4_ = 1;
                      }
                      else {
                        from_proc = (REF_INT *)malloc((long)source._4_4_ << 2);
                        if (from_proc == (REF_INT *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x406,"ref_interp_geom_nodes","malloc best_node of REF_INT NULL");
                          ref_interp_local._4_4_ = 2;
                        }
                        else if (source._4_4_ < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x407,"ref_interp_geom_nodes",
                                 "malloc from_proc of REF_INT negative");
                          ref_interp_local._4_4_ = 1;
                        }
                        else {
                          dist = (REF_DBL)malloc((long)source._4_4_ << 2);
                          if ((void *)dist == (void *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x407,"ref_interp_geom_nodes","malloc from_proc of REF_INT NULL"
                                  );
                            ref_interp_local._4_4_ = 2;
                          }
                          else {
                            for (xyz._4_4_ = 0; xyz._4_4_ < source._4_4_; xyz._4_4_ = xyz._4_4_ + 1)
                            {
                              local_xyz = (REF_DBL *)(local_node + (long)(xyz._4_4_ * 3) * 2);
                              _nrecv[xyz._4_4_] = 1e+20;
                              from_proc[xyz._4_4_] = -1;
                              for (xyz._0_4_ = 0; (int)xyz < _from_geom_node->n;
                                  xyz._0_4_ = (int)xyz + 1) {
                                from_item = _from_geom_node->value[(int)xyz];
                                dVar3 = pow(*local_xyz -
                                            *(double *)
                                             (to_geom_list[3].value + (long)(from_item * 0xf) * 2),
                                            2.0);
                                dVar4 = pow(local_xyz[1] -
                                            *(double *)
                                             (to_geom_list[3].value +
                                             (long)(from_item * 0xf + 1) * 2),2.0);
                                dVar5 = pow(local_xyz[2] -
                                            *(double *)
                                             (to_geom_list[3].value +
                                             (long)(from_item * 0xf + 2) * 2),2.0);
                                best_dist = (REF_DBL *)(dVar3 + dVar4 + dVar5);
                                best_dist = (REF_DBL *)sqrt((double)best_dist);
                                if (((double)best_dist < _nrecv[xyz._4_4_]) || ((int)xyz == 0)) {
                                  _nrecv[xyz._4_4_] = (REF_DBL)best_dist;
                                  from_proc[xyz._4_4_] = from_item;
                                }
                              }
                            }
                            uVar1 = ref_mpi_allminwho((REF_MPI)to_node,_nrecv,(REF_INT *)dist,
                                                      source._4_4_);
                            if (uVar1 == 0) {
                              send_proc._4_4_ = 0;
                              for (xyz._4_4_ = 0; xyz._4_4_ < source._4_4_;
                                  xyz._4_4_ = xyz._4_4_ + 1) {
                                if (to_node->max == *(int *)((long)dist + (long)xyz._4_4_ * 4)) {
                                  send_proc._4_4_ = send_proc._4_4_ + 1;
                                }
                              }
                              if (send_proc._4_4_ * 4 < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x41f,"ref_interp_geom_nodes",
                                       "malloc send_bary of REF_DBL negative");
                                ref_interp_local._4_4_ = 1;
                              }
                              else {
                                recv_bary = (REF_DBL *)malloc((long)(send_proc._4_4_ << 2) << 3);
                                if (recv_bary == (REF_DBL *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x41f,"ref_interp_geom_nodes",
                                         "malloc send_bary of REF_DBL NULL");
                                  ref_interp_local._4_4_ = 2;
                                }
                                else if (send_proc._4_4_ < 0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x420,"ref_interp_geom_nodes",
                                         "malloc send_cell of REF_INT negative");
                                  ref_interp_local._4_4_ = 1;
                                }
                                else {
                                  recv_cell = (REF_INT *)malloc((long)send_proc._4_4_ << 2);
                                  if (recv_cell == (REF_INT *)0x0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x420,"ref_interp_geom_nodes",
                                           "malloc send_cell of REF_INT NULL");
                                    ref_interp_local._4_4_ = 2;
                                  }
                                  else if (send_proc._4_4_ < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x421,"ref_interp_geom_nodes",
                                           "malloc send_node of REF_INT negative");
                                    ref_interp_local._4_4_ = 1;
                                  }
                                  else {
                                    recv_node = (REF_INT *)malloc((long)send_proc._4_4_ << 2);
                                    if (recv_node == (REF_INT *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                             ,0x421,"ref_interp_geom_nodes",
                                             "malloc send_node of REF_INT NULL");
                                      ref_interp_local._4_4_ = 2;
                                    }
                                    else if (send_proc._4_4_ < 0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                             ,0x422,"ref_interp_geom_nodes",
                                             "malloc send_proc of REF_INT negative");
                                      ref_interp_local._4_4_ = 1;
                                    }
                                    else {
                                      my_proc = (REF_INT *)malloc((long)send_proc._4_4_ << 2);
                                      if (my_proc == (REF_INT *)0x0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x422,"ref_interp_geom_nodes",
                                               "malloc send_proc of REF_INT NULL");
                                        ref_interp_local._4_4_ = 2;
                                      }
                                      else if (send_proc._4_4_ < 0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x423,"ref_interp_geom_nodes",
                                               "malloc my_proc of REF_INT negative");
                                        ref_interp_local._4_4_ = 1;
                                      }
                                      else {
                                        recv_proc = (REF_INT *)malloc((long)send_proc._4_4_ << 2);
                                        if (recv_proc == (REF_INT *)0x0) {
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                 ,0x423,"ref_interp_geom_nodes",
                                                 "malloc my_proc of REF_INT NULL");
                                          ref_interp_local._4_4_ = 2;
                                        }
                                        else {
                                          for (ref_private_macro_code_rss_8 = 0;
                                              ref_private_macro_code_rss_8 < send_proc._4_4_;
                                              ref_private_macro_code_rss_8 =
                                                   ref_private_macro_code_rss_8 + 1) {
                                            recv_proc[ref_private_macro_code_rss_8] = to_node->max;
                                          }
                                          send_proc._4_4_ = 0;
                                          for (xyz._4_4_ = 0; xyz._4_4_ < source._4_4_;
                                              xyz._4_4_ = xyz._4_4_ + 1) {
                                            if (to_node->max ==
                                                *(int *)((long)dist + (long)xyz._4_4_ * 4)) {
                                              if (from_proc[xyz._4_4_] == -1) {
                                                printf("%s: %d: %s: %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x428,"ref_interp_geom_nodes","no geom node");
                                                return 1;
                                              }
                                              local_xyz = (REF_DBL *)
                                                          (local_node + (long)(xyz._4_4_ * 3) * 2);
                                              recv_node[send_proc._4_4_] =
                                                   *(REF_INT *)
                                                    ((long)pvStack_88 + (long)xyz._4_4_ * 4);
                                              my_proc[send_proc._4_4_] = pRStack_98[xyz._4_4_];
                                              if (to_grid->twod == 0) {
                                                uVar1 = ref_interp_exhaustive_tet_around_node
                                                                  ((REF_INTERP)from_grid,
                                                                   from_proc[xyz._4_4_],local_xyz,
                                                                   recv_cell + send_proc._4_4_,
                                                                   recv_bary +
                                                                   (send_proc._4_4_ << 2));
                                                if (uVar1 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x435,"ref_interp_geom_nodes",(ulong)uVar1,
                                                  "tet around node");
                                                  return uVar1;
                                                }
                                              }
                                              else {
                                                uVar1 = ref_interp_exhaustive_tri_around_node
                                                                  ((REF_INTERP)from_grid,
                                                                   from_proc[xyz._4_4_],local_xyz,
                                                                   recv_cell + send_proc._4_4_,
                                                                   recv_bary +
                                                                   (send_proc._4_4_ << 2));
                                                if (uVar1 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x430,"ref_interp_geom_nodes",(ulong)uVar1,
                                                  "tri around node");
                                                  return uVar1;
                                                }
                                              }
                                              send_proc._4_4_ = send_proc._4_4_ + 1;
                                            }
                                          }
                                          uVar1 = ref_mpi_blindsend((REF_MPI)to_node,my_proc,
                                                                    recv_node,1,send_proc._4_4_,
                                                                    &send_bary,(REF_INT *)&send_proc
                                                                    ,1);
                                          if (uVar1 == 0) {
                                            uVar1 = ref_mpi_blindsend((REF_MPI)to_node,my_proc,
                                                                      recv_cell,1,send_proc._4_4_,
                                                                      &send_node,
                                                                      (REF_INT *)&send_proc,1);
                                            if (uVar1 == 0) {
                                              uVar1 = ref_mpi_blindsend((REF_MPI)to_node,my_proc,
                                                                        recv_proc,1,send_proc._4_4_,
                                                                        &send_cell,
                                                                        (REF_INT *)&send_proc,1);
                                              if (uVar1 == 0) {
                                                uVar1 = ref_mpi_blindsend((REF_MPI)to_node,my_proc,
                                                                          recv_bary,4,
                                                                          send_proc._4_4_,
                                                                          (void **)&
                                                  ref_private_macro_code_rss_1,(REF_INT *)&send_proc
                                                  ,3);
                                                if (uVar1 == 0) {
                                                  for (xyz._0_4_ = 0; (int)xyz < (int)send_proc;
                                                      xyz._0_4_ = (int)xyz + 1) {
                                                    dVar3 = *(double *)
                                                             ((long)_ref_private_macro_code_rss_1 +
                                                             (long)((int)xyz << 2) * 8);
                                                    if ((((dVar3 < (double)from_grid->cell[0xd] ||
                                                           dVar3 == (double)from_grid->cell[0xd]) ||
                                                         (dVar3 = *(double *)
                                                                   ((long)
                                                  _ref_private_macro_code_rss_1 +
                                                  (long)((int)xyz * 4 + 1) * 8),
                                                  dVar3 < (double)from_grid->cell[0xd] ||
                                                  dVar3 == (double)from_grid->cell[0xd])) ||
                                                  (dVar3 = *(double *)
                                                            ((long)_ref_private_macro_code_rss_1 +
                                                            (long)((int)xyz * 4 + 2) * 8),
                                                  dVar3 < (double)from_grid->cell[0xd] ||
                                                  dVar3 == (double)from_grid->cell[0xd])) ||
                                                  (dVar3 = *(double *)
                                                            ((long)_ref_private_macro_code_rss_1 +
                                                            (long)((int)xyz * 4 + 3) * 8),
                                                  dVar3 < (double)from_grid->cell[0xd] ||
                                                  dVar3 == (double)from_grid->cell[0xd])) {
                                                    *(int *)(from_grid->cell + 7) =
                                                         *(int *)(from_grid->cell + 7) + 1;
                                                  }
                                                  else {
                                                    *(int *)((long)from_grid->cell + 0x34) =
                                                         *(int *)((long)from_grid->cell + 0x34) + 1;
                                                    to_item = *(int *)((long)send_bary +
                                                                      (long)(int)xyz * 4);
                                                    lVar2 = (long)(int)(&from_grid->cell[10]->type)
                                                                       [to_item];
                                                    if (lVar2 != -1) {
                                                      printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x44e,"ref_interp_geom_nodes",
                                                  "geom already found?",0xffffffffffffffff,lVar2);
                                                  return 1;
                                                  }
                                                  if ((&from_grid->cell[9]->type)[to_item] !=
                                                      REF_CELL_EDG) {
                                                    uVar1 = ref_agents_delete((REF_AGENTS)
                                                                              from_grid->cell[0xf],
                                                                              to_item);
                                                    if (uVar1 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x450,"ref_interp_geom_nodes",(ulong)uVar1,"deq")
                                                  ;
                                                  return uVar1;
                                                  }
                                                  (&from_grid->cell[9]->type)[to_item] =
                                                       REF_CELL_EDG;
                                                  }
                                                  (&from_grid->cell[10]->type)[to_item] =
                                                       send_node[(int)xyz];
                                                  (&from_grid->cell[0xb]->type)[to_item] =
                                                       send_cell[(int)xyz];
                                                  for (best_node._4_4_ = 0; best_node._4_4_ < 4;
                                                      best_node._4_4_ = best_node._4_4_ + 1) {
                                                    *(undefined8 *)
                                                     (&from_grid->cell[0xc]->type +
                                                     (long)(best_node._4_4_ + to_item * 4) * 2) =
                                                         *(undefined8 *)
                                                          ((long)_ref_private_macro_code_rss_1 +
                                                          (long)(best_node._4_4_ + (int)xyz * 4) * 8
                                                          );
                                                  }
                                                  uVar1 = ref_interp_push_onto_queue
                                                                    ((REF_INTERP)from_grid,to_item);
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x457,"ref_interp_geom_nodes",(ulong)uVar1,"push"
                                                  );
                                                  return uVar1;
                                                  }
                                                  }
                                                  }
                                                  uVar1 = ref_mpi_allsum((REF_MPI)to_node,
                                                                         (void *)((long)from_grid->
                                                                                        cell + 0x34)
                                                                         ,1,1);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_mpi_allsum((REF_MPI)to_node,
                                                                           from_grid->cell + 7,1,1);
                                                    if (uVar1 == 0) {
                                                      if (send_bary != (REF_DBL *)0x0) {
                                                        free(send_bary);
                                                      }
                                                      if (send_node != (REF_INT *)0x0) {
                                                        free(send_node);
                                                      }
                                                      if (send_cell != (REF_INT *)0x0) {
                                                        free(send_cell);
                                                      }
                                                      if (_ref_private_macro_code_rss_1 !=
                                                          (void *)0x0) {
                                                        free(_ref_private_macro_code_rss_1);
                                                      }
                                                      if (recv_bary != (REF_DBL *)0x0) {
                                                        free(recv_bary);
                                                      }
                                                      if (recv_proc != (REF_INT *)0x0) {
                                                        free(recv_proc);
                                                      }
                                                      if (recv_cell != (REF_INT *)0x0) {
                                                        free(recv_cell);
                                                      }
                                                      if (recv_node != (REF_INT *)0x0) {
                                                        free(recv_node);
                                                      }
                                                      if (my_proc != (REF_INT *)0x0) {
                                                        free(my_proc);
                                                      }
                                                      if (dist != 0.0) {
                                                        free((void *)dist);
                                                      }
                                                      if (from_proc != (REF_INT *)0x0) {
                                                        free(from_proc);
                                                      }
                                                      if (_nrecv != (REF_DBL *)0x0) {
                                                        free(_nrecv);
                                                      }
                                                      if (pRStack_98 != (REF_INT *)0x0) {
                                                        free(pRStack_98);
                                                      }
                                                      if (pvStack_88 != (void *)0x0) {
                                                        free(pvStack_88);
                                                      }
                                                      if (local_node != (REF_INT *)0x0) {
                                                        free(local_node);
                                                      }
                                                      if (global_xyz != (REF_DBL *)0x0) {
                                                        free(global_xyz);
                                                      }
                                                      if (global_node != (REF_INT *)0x0) {
                                                        free(global_node);
                                                      }
                                                      ref_list_free(_from_geom_node);
                                                      ref_list_free(from_geom_list);
                                                      ref_interp_local._4_4_ = 0;
                                                    }
                                                    else {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x45f,"ref_interp_geom_nodes",(ulong)uVar1,"as");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x45d,"ref_interp_geom_nodes",(ulong)uVar1,"as");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x445,"ref_interp_geom_nodes",(ulong)uVar1,
                                                  "blind send bary");
                                                  ref_interp_local._4_4_ = uVar1;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x442,"ref_interp_geom_nodes",(ulong)uVar1,
                                                  "blind send proc");
                                                ref_interp_local._4_4_ = uVar1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x43f,"ref_interp_geom_nodes",(ulong)uVar1,
                                                  "blind send cell");
                                              ref_interp_local._4_4_ = uVar1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x43c,"ref_interp_geom_nodes",(ulong)uVar1,
                                                  "blind send node");
                                            ref_interp_local._4_4_ = uVar1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x419,"ref_interp_geom_nodes",(ulong)uVar1,"who");
                              ref_interp_local._4_4_ = uVar1;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x403,"ref_interp_geom_nodes",(ulong)uVar1,"cat");
                    ref_interp_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x3fe,"ref_interp_geom_nodes",(ulong)uVar1,"cat");
                  ref_interp_local._4_4_ = uVar1;
                }
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3f0,"ref_interp_geom_nodes",(ulong)uVar1,"from list");
          ref_interp_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3ef,"ref_interp_geom_nodes",(ulong)uVar1,"to list");
        ref_interp_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x3ee,"ref_interp_geom_nodes",(ulong)uVar1,"create list");
      ref_interp_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x3ed,
           "ref_interp_geom_nodes",(ulong)uVar1,"create list");
    ref_interp_local._4_4_ = uVar1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_geom_nodes(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_LIST to_geom_list, from_geom_list;
  REF_INT to_geom_node, from_geom_node;
  REF_INT to_item, from_item;
  REF_DBL *xyz;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT total_node, *source, i, *best_node, *from_proc;
  REF_DBL dist, *best_dist;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;

  RSS(ref_list_create(&to_geom_list), "create list");
  RSS(ref_list_create(&from_geom_list), "create list");
  RSS(ref_interp_geom_node_list(to_grid, to_geom_list), "to list");
  RSS(ref_interp_geom_node_list(from_grid, from_geom_list), "from list");

  ref_malloc(local_node, ref_list_n(to_geom_list), REF_INT);
  ref_malloc(local_xyz, 3 * ref_list_n(to_geom_list), REF_DBL);
  each_ref_list_item(to_geom_list, to_item) {
    to_geom_node = ref_list_value(to_geom_list, to_item);
    local_node[to_item] = to_geom_node;
    local_xyz[0 + 3 * to_item] = ref_node_xyz(to_node, 0, to_geom_node);
    local_xyz[1 + 3 * to_item] = ref_node_xyz(to_node, 1, to_geom_node);
    local_xyz[2 + 3 * to_item] = ref_node_xyz(to_node, 2, to_geom_node);
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ref_list_n(to_geom_list), (void *)local_xyz,
                        &total_node, &source, (void **)&global_xyz,
                        REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ref_list_n(to_geom_list),
                        (void *)local_node, &total_node, &source,
                        (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_dist, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (to_item = 0; to_item < total_node; to_item++) {
    xyz = &(global_xyz[3 * to_item]);
    best_dist[to_item] = 1.0e20;
    best_node[to_item] = REF_EMPTY;
    each_ref_list_item(from_geom_list, from_item) {
      from_geom_node = ref_list_value(from_geom_list, from_item);
      dist = pow(xyz[0] - ref_node_xyz(from_node, 0, from_geom_node), 2) +
             pow(xyz[1] - ref_node_xyz(from_node, 1, from_geom_node), 2) +
             pow(xyz[2] - ref_node_xyz(from_node, 2, from_geom_node), 2);
      dist = sqrt(dist);
      if (dist < best_dist[to_item] || 0 == from_item) {
        best_dist[to_item] = dist;
        best_node[to_item] = from_geom_node;
      }
    }
  }

  RSS(ref_mpi_allminwho(ref_mpi, best_dist, from_proc, total_node), "who");

  nsend = 0;
  for (to_item = 0; to_item < total_node; to_item++)
    if (ref_mpi_rank(ref_mpi) == from_proc[to_item]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));

  nsend = 0;
  for (to_item = 0; to_item < total_node; to_item++)
    if (ref_mpi_rank(ref_mpi) == from_proc[to_item]) {
      RUS(REF_EMPTY, best_node[to_item], "no geom node");
      xyz = &(global_xyz[3 * to_item]);
      send_node[nsend] = global_node[to_item];
      send_proc[nsend] = source[to_item];
      if (ref_grid_twod(from_grid)) {
        RSS(ref_interp_exhaustive_tri_around_node(
                ref_interp, best_node[to_item], xyz, &(send_cell[nsend]),
                &(send_bary[4 * nsend])),
            "tri around node");
      } else {
        RSS(ref_interp_exhaustive_tet_around_node(
                ref_interp, best_node[to_item], xyz, &(send_cell[nsend]),
                &(send_bary[4 * nsend])),
            "tet around node");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (from_item = 0; from_item < nrecv; from_item++) {
    if (recv_bary[0 + 4 * from_item] > ref_interp->inside &&
        recv_bary[1 + 4 * from_item] > ref_interp->inside &&
        recv_bary[2 + 4 * from_item] > ref_interp->inside &&
        recv_bary[3 + 4 * from_item] > ref_interp->inside) {
      ref_interp->n_geom++;
      to_geom_node = recv_node[from_item];
      REIS(REF_EMPTY, ref_interp->cell[to_geom_node], "geom already found?");
      if (ref_interp->agent_hired[to_geom_node]) { /* need to dequeue */
        RSS(ref_agents_delete(ref_interp->ref_agents, to_geom_node), "deq");
        ref_interp->agent_hired[to_geom_node] = REF_FALSE;
      }
      ref_interp->cell[to_geom_node] = recv_cell[from_item];
      ref_interp->part[to_geom_node] = recv_proc[from_item];
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * to_geom_node] = recv_bary[i + 4 * from_item];
      RSS(ref_interp_push_onto_queue(ref_interp, to_geom_node), "push");
    } else {
      ref_interp->n_geom_fail++;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_geom), 1, REF_INT_TYPE), "as");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_geom_fail), 1, REF_INT_TYPE),
      "as");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_node);
  ref_free(best_dist);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);
  ref_list_free(from_geom_list);
  ref_list_free(to_geom_list);
  return REF_SUCCESS;
}